

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O3

void LEARNER::dispatch(vw *all,v_array<example_*> examples)

{
  uint64_t *puVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = (long)examples._end - (long)examples._begin >> 3;
  puVar1 = &all->p->end_parsed_examples;
  *puVar1 = *puVar1 + lVar3;
  if (examples._end != examples._begin) {
    lVar2 = 0;
    do {
      process_example(all,examples._begin[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar2);
  }
  return;
}

Assistant:

bool inline is_save_cmd(example* ec)
{
  return (ec->tag.size() >= 4) && (0 == strncmp((const char*)ec->tag.begin(), "save", 4));
}